

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtStr.c
# Opt level: O3

newtRef NsSubStr(newtRefArg rcvr,newtRefArg r,newtRefArg start,newtRefArg count)

{
  _Bool _Var1;
  int iVar2;
  char *__s;
  size_t sVar3;
  int64_t iVar4;
  newtRef nVar5;
  char *s;
  int32_t err;
  int iVar6;
  
  _Var1 = NewtRefIsString(r);
  if (_Var1) {
    _Var1 = NewtRefIsInteger(start);
    if (_Var1) {
      __s = (char *)NewtRefToData(r);
      sVar3 = strlen(__s);
      iVar4 = NewtRefToInteger(start);
      iVar6 = (int)iVar4;
      if (sVar3 < (ulong)(long)iVar6) {
        nVar5 = NewtMakeString("",true);
        return nVar5;
      }
      _Var1 = NewtRefIsNIL(count);
      iVar2 = (int)sVar3;
      if (!_Var1) {
        _Var1 = NewtRefIsInteger(count);
        if (!_Var1) {
          err = -0xbd16;
          goto LAB_0010dcd8;
        }
        iVar4 = NewtRefToInteger(count);
        iVar2 = (int)iVar4 + iVar6;
        if (sVar3 < (ulong)(long)iVar2) {
          iVar2 = (int)sVar3;
        }
      }
      sVar3 = (size_t)(iVar2 - iVar6);
      s = (char *)malloc(sVar3 + 1);
      memcpy(s,__s + iVar6,sVar3);
      s[sVar3] = '\0';
      nVar5 = NewtMakeString(s,false);
      free(s);
      return nVar5;
    }
    err = -0xbd16;
    count = start;
  }
  else {
    err = -0xbd12;
    count = r;
  }
LAB_0010dcd8:
  nVar5 = NewtThrow(err,count);
  return nVar5;
}

Assistant:

newtRef NsSubStr(newtRefArg rcvr, newtRefArg r, newtRefArg start, newtRefArg count)
{
    char* theString;
    char* theBuffer;
    int theStart, theEnd;
    size_t theLen;
    newtRefVar theResult;
    
    (void) rcvr;
    
    /* check parameters */
    if (! NewtRefIsString(r))
        return NewtThrow(kNErrNotAString, r);
    if (! NewtRefIsInteger(start))
        return NewtThrow(kNErrNotAnInteger, start);
    
    theString = NewtRefToString(r);
    theLen = strlen(theString);
    
    theStart = (int)NewtRefToInteger(start);
    if (theStart > theLen) {
        return NewtMakeString("", true);
    }
    
    if (!NewtRefIsNIL(count))
    {
        if (!NewtRefIsInteger(count))
        {
            return NewtThrow(kNErrNotAnInteger, count);
        }
        theEnd = theStart + (int)NewtRefToInteger(count);
        if (theEnd > theLen)
        {
            theEnd = (int)theLen;
        }
    } else {
        theEnd = (int)theLen;
    }
    
    /* new length */
    theLen = theEnd - theStart;
    
    /* create a buffer to copy the characters to */
    theBuffer = (char*) malloc(theLen + 1);
    (void) memcpy(theBuffer, (const char*) &theString[theStart], theLen);
    theBuffer[theLen] = 0;
    theResult = NewtMakeString(theBuffer, false);
    free(theBuffer);
    
    return theResult;
}